

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3detectionoutput_x86_avx.cpp
# Opt level: O3

int __thiscall
ncnn::Yolov3DetectionOutput_x86_avx::forward
          (Yolov3DetectionOutput_x86_avx *this,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  float *pfVar1;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
  *this_00;
  size_t sVar2;
  iterator __position;
  Mat *this_01;
  undefined1 auVar3 [12];
  undefined1 auVar4 [12];
  undefined8 uVar5;
  undefined8 uVar6;
  void *pvVar7;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *pvVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  float *pfVar12;
  undefined4 *puVar13;
  _func_int **pp_Var14;
  undefined4 uVar15;
  int iVar16;
  BBoxRect *__args;
  float *pfVar17;
  _func_int *p_Var18;
  _func_int *p_Var19;
  pointer pvVar20;
  pointer pMVar21;
  long lVar22;
  long lVar23;
  long in_R10;
  float *pfVar24;
  ulong uVar25;
  uint _h;
  float fVar26;
  float fVar27;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined4 extraout_XMM0_Dd;
  undefined1 extraout_var [60];
  undefined1 auVar36 [16];
  undefined1 auVar38 [16];
  undefined1 auVar37 [16];
  undefined1 auVar39 [64];
  float fVar46;
  float fVar47;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  float fVar48;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar49 [16];
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  undefined1 auVar54 [16];
  undefined1 in_register_00001384 [12];
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  bbox_rects;
  vector<unsigned_long,_std::allocator<unsigned_long>_> picked;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  all_bbox_rects;
  vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
  local_198;
  ulong local_178;
  long local_170;
  BBoxRect local_168;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  local_148;
  undefined1 local_128 [16];
  long local_118;
  float *local_110;
  float *local_108;
  float *local_100;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_f8;
  Option *local_f0;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_e8;
  pointer local_e0;
  long local_d8;
  long local_d0;
  void *local_c8;
  long local_c0;
  void *local_b8;
  long local_b0;
  long local_a8;
  float *local_a0;
  undefined1 local_98 [16];
  undefined1 local_88 [8];
  float fStack_80;
  float fStack_7c;
  undefined1 local_78 [8];
  float fStack_70;
  float fStack_6c;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  local_148.
  super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_148.
  super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_148.
  super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f8 = top_blobs;
  local_f0 = opt;
  if ((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
      super__Vector_impl_data._M_finish !=
      (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    local_178 = 0;
    local_e8 = bottom_blobs;
    do {
      pvVar8 = local_e8;
      local_198.
      super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
      ._M_impl.super__Vector_impl_data._0_16_ = ZEXT816(0) << 0x40;
      local_198.
      super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
      ::resize(&local_198,
               (long)*(int *)(&this->field_0xd4 +
                             (long)this->_vptr_Yolov3DetectionOutput_x86_avx[-3]));
      pMVar21 = (pvVar8->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pp_Var14 = this->_vptr_Yolov3DetectionOutput_x86_avx;
      p_Var18 = pp_Var14[-3];
      iVar10 = *(int *)(&this->field_0xd4 + (long)p_Var18);
      iVar9 = pMVar21[local_178].c / iVar10;
      if (iVar9 != *(int *)(&this->field_0xd0 + (long)p_Var18) + 5) {
        std::
        vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
        ::~vector(&local_198);
        iVar10 = -1;
        goto LAB_002b81d9;
      }
      if (0 < iVar10) {
        pMVar21 = pMVar21 + local_178;
        uVar25._0_4_ = pMVar21->w;
        uVar25._4_4_ = pMVar21->h;
        auVar28._8_8_ = 0;
        auVar28._0_8_ = uVar25;
        p_Var19 = (_func_int *)((long)&this->_vptr_Yolov3DetectionOutput_x86_avx + (long)p_Var18);
        auVar41 = vcvtdq2ps_avx(auVar28);
        fVar26 = *(float *)(*(long *)(p_Var19 + 0x170) + local_178 * 4);
        auVar40._0_4_ = fVar26 * auVar41._0_4_;
        auVar40._4_4_ = fVar26 * auVar41._4_4_;
        auVar40._8_4_ = fVar26 * auVar41._8_4_;
        auVar40._12_4_ = fVar26 * auVar41._12_4_;
        uVar15 = vextractps_avx(auVar28,1);
        local_118 = CONCAT44((int)((ulong)*(long *)(p_Var19 + 0x170) >> 0x20),uVar15);
        in_R10 = CONCAT44((int)((ulong)in_R10 >> 0x20),(undefined4)uVar25);
        local_98 = vroundps_avx(auVar40,0xb);
        local_d0 = (long)iVar9;
        auVar29._0_12_ = ZEXT412(0x3f000000) << 0x40;
        auVar29._12_4_ = 0x3f000000;
        local_78 = auVar41._0_8_;
        register0x00001248 = auVar29._8_8_;
        auVar28 = vrcpps_avx(_local_78);
        fVar26 = auVar28._0_4_;
        auVar36._0_4_ = auVar41._0_4_ * fVar26;
        fVar27 = auVar28._4_4_;
        auVar36._4_4_ = auVar41._4_4_ * fVar27;
        fVar46 = auVar28._8_4_;
        auVar36._8_4_ = fVar46 * 0.5;
        fVar47 = auVar28._12_4_;
        auVar36._12_4_ = fVar47 * 0.5;
        auVar41._8_4_ = 0x3f800000;
        auVar41._0_8_ = 0x3f8000003f800000;
        auVar41._12_4_ = 0x3f800000;
        auVar41 = vsubps_avx(auVar41,auVar36);
        local_88._0_4_ = fVar26 + fVar26 * auVar41._0_4_;
        local_88._4_4_ = fVar27 + fVar27 * auVar41._4_4_;
        fStack_80 = fVar46 + fVar46 * auVar41._8_4_;
        fStack_7c = fVar47 + fVar47 * auVar41._12_4_;
        lVar22 = (long)iVar10 * local_178 * 4;
        local_170 = 0;
        local_e0 = pMVar21;
        local_d8 = lVar22;
        local_b0 = in_R10;
        do {
          if (pMVar21->dims == 3) {
            lVar11 = (long)pMVar21->h * (long)pMVar21->w;
          }
          else {
            lVar11 = (long)pMVar21->h * (long)pMVar21->w * (long)pMVar21->d;
          }
          uVar25 = pMVar21->elemsize;
          if (0 < (int)local_118) {
            lVar23 = local_170 * local_d0;
            auVar30._8_8_ = 0;
            auVar30._0_8_ =
                 *(ulong *)(*(long *)(p_Var19 + 0xe0) +
                           (long)((int)*(float *)(*(long *)(p_Var19 + 0x128) + lVar22 +
                                                 local_170 * 4) * 2) * 4);
            local_c8 = pMVar21->data;
            sVar2 = pMVar21->cstep;
            pfVar24 = (float *)(sVar2 * lVar23 * uVar25 + (long)local_c8);
            local_100 = (float *)((lVar23 + 1) * sVar2 * uVar25 + (long)local_c8);
            local_108 = (float *)((lVar23 + 2) * sVar2 * uVar25 + (long)local_c8);
            local_110 = (float *)((lVar23 + 3) * sVar2 * uVar25 + (long)local_c8);
            pfVar17 = (float *)((lVar23 + 4) * sVar2 * uVar25 + (long)local_c8);
            local_c8 = (void *)((lVar23 + 5) * sVar2 * uVar25 + (long)local_c8);
            iVar10 = (int)((lVar11 * uVar25 + 0xf & 0xfffffffffffffff0) / uVar25);
            auVar37._8_4_ = 0x3f800000;
            auVar37._0_8_ = 0x3f8000003f800000;
            auVar37._12_4_ = 0x3f800000;
            local_68 = vmovlhps_avx(auVar37,auVar30);
            local_a8 = (long)iVar10;
            lVar22 = 0;
            do {
              local_c0 = lVar22;
              if (0 < (int)in_R10) {
                auVar31._0_4_ = (float)(int)lVar22;
                auVar31._4_12_ = in_register_00001384;
                local_b8 = (void *)((long)local_c8 + lVar22 * in_R10 * 4);
                local_58 = vshufps_avx(auVar31,local_98,0x40);
                lVar22 = 0;
                do {
                  p_Var18 = this->_vptr_Yolov3DetectionOutput_x86_avx[-3];
                  lVar11 = *(int *)(&this->field_0xd0 + (long)p_Var18) * local_a8;
                  if ((int)lVar11 < 1) {
                    iVar9 = 0;
                    local_128 = SUB6416(ZEXT464(0xff7fffff),0);
                  }
                  else {
                    pfVar12 = (float *)((long)local_b8 + lVar22 * 4);
                    pfVar1 = pfVar12 + lVar11;
                    iVar9 = 0;
                    auVar39 = ZEXT464(0xff7fffff);
                    iVar16 = 0;
                    do {
                      if (auVar39._0_4_ < *pfVar12) {
                        iVar9 = iVar16;
                      }
                      local_128 = vmaxss_avx(ZEXT416((uint)*pfVar12),auVar39._0_16_);
                      auVar39 = ZEXT1664(local_128);
                      pfVar12 = pfVar12 + iVar10;
                      iVar16 = iVar16 + 1;
                    } while (pfVar12 < pfVar1);
                  }
                  local_a0 = pfVar24;
                  fVar26 = expf(-*pfVar17);
                  fVar27 = expf(-(float)local_128._0_4_);
                  pfVar24 = local_a0;
                  fVar26 = 1.0 / ((fVar27 + 1.0) * fVar26 + 1.0);
                  if (*(float *)(&this->field_0xd8 + (long)p_Var18) <= fVar26) {
                    fVar27 = expf(-*local_a0);
                    local_128 = ZEXT416((uint)(fVar27 + 1.0));
                    fVar27 = expf(-*local_100);
                    local_48 = vinsertps_avx(local_128,ZEXT416((uint)(fVar27 + 1.0)),0x10);
                    local_128._0_4_ = expf(*local_108);
                    local_128._4_4_ = extraout_XMM0_Db;
                    local_128._8_4_ = extraout_XMM0_Dc;
                    local_128._12_4_ = extraout_XMM0_Dd;
                    auVar39._0_4_ = expf(*local_110);
                    auVar39._4_60_ = extraout_var;
                    auVar28 = vrcpps_avx(local_48);
                    fVar27 = local_68._0_4_ * auVar28._0_4_;
                    fVar46 = local_68._4_4_ * auVar28._4_4_;
                    fVar47 = local_68._8_4_ * auVar28._8_4_;
                    fVar48 = local_68._12_4_ * auVar28._12_4_;
                    auVar49._0_4_ = local_48._0_4_ * fVar27;
                    auVar49._4_4_ = local_48._4_4_ * fVar46;
                    auVar49._8_4_ = local_48._8_4_ * fVar47;
                    auVar49._12_4_ = local_48._12_4_ * fVar48;
                    auVar29 = vsubps_avx(local_68,auVar49);
                    fVar27 = fVar27 + auVar28._0_4_ * auVar29._0_4_;
                    fVar46 = fVar46 + auVar28._4_4_ * auVar29._4_4_;
                    auVar33._4_4_ = fVar46;
                    auVar33._0_4_ = fVar27;
                    auVar42._8_8_ = local_128._0_8_;
                    auVar42._0_8_ = local_128._0_8_;
                    auVar41 = vinsertps_avx(auVar42,auVar39._0_16_,0x30);
                    auVar3._4_8_ = auVar41._8_8_;
                    auVar3._0_4_ = local_68._4_4_ * auVar41._4_4_;
                    auVar32._0_8_ = auVar3._0_8_ << 0x20;
                    auVar32._8_4_ = local_68._8_4_ * auVar41._8_4_;
                    auVar32._12_4_ = local_68._12_4_ * auVar41._12_4_;
                    auVar43._0_4_ = (float)(int)lVar22;
                    auVar43._4_12_ = local_58._4_12_;
                    auVar33._8_8_ = auVar32._8_8_;
                    auVar41 = vrcpps_avx(auVar43);
                    fVar50 = fVar27 * auVar41._0_4_;
                    fVar51 = fVar46 * auVar41._4_4_;
                    fVar52 = auVar32._8_4_ * auVar41._8_4_;
                    fVar53 = auVar32._12_4_ * auVar41._12_4_;
                    auVar54._0_4_ = auVar43._0_4_ * fVar50;
                    auVar54._4_4_ = local_58._4_4_ * fVar51;
                    auVar54._8_4_ = local_58._8_4_ * fVar52;
                    auVar54._12_4_ = local_58._12_4_ * fVar53;
                    auVar36 = vsubps_avx(auVar33,auVar54);
                    auVar34._0_4_ = fVar50 + auVar41._0_4_ * auVar36._0_4_;
                    auVar34._4_4_ = fVar51 + auVar41._4_4_ * auVar36._4_4_;
                    auVar34._8_4_ = fVar52 + auVar41._8_4_ * auVar36._8_4_;
                    auVar34._12_4_ = fVar53 + auVar41._12_4_ * auVar36._12_4_;
                    auVar38._0_4_ = (fVar27 + auVar43._0_4_) * (float)local_88._0_4_;
                    auVar38._4_4_ = (fVar46 + local_58._4_4_) * (float)local_88._4_4_;
                    auVar38._8_4_ =
                         (fVar47 + auVar28._8_4_ * auVar29._8_4_ + local_58._8_4_) * fStack_80;
                    auVar38._12_4_ =
                         (fVar48 + auVar28._12_4_ * auVar29._12_4_ + local_58._12_4_) * fStack_7c;
                    auVar44._0_4_ = auVar34._0_4_ * (float)local_78._0_4_;
                    auVar44._4_4_ = auVar34._4_4_ * (float)local_78._4_4_;
                    auVar44._8_4_ = auVar34._8_4_ * fStack_70;
                    auVar44._12_4_ = auVar34._12_4_ * fStack_6c;
                    auVar41 = vshufpd_avx(auVar44,auVar38,1);
                    auVar28 = vsubps_avx(auVar38,auVar41);
                    auVar4._4_8_ = auVar44._8_8_;
                    auVar4._0_4_ = auVar44._4_4_ + auVar41._4_4_;
                    auVar45._0_8_ = auVar4._0_8_ << 0x20;
                    auVar45._8_4_ = auVar44._8_4_ + auVar41._8_4_;
                    auVar45._12_4_ = auVar44._12_4_ + auVar41._12_4_;
                    auVar41 = vmovshdup_avx(auVar34);
                    auVar35._0_4_ = auVar41._0_4_ * auVar34._0_4_;
                    auVar35._4_4_ = auVar41._4_4_ * auVar34._4_4_;
                    auVar35._8_4_ = auVar41._8_4_ * auVar34._8_4_;
                    auVar35._12_4_ = auVar41._12_4_ * auVar34._12_4_;
                    local_168.xmin = auVar28._0_4_;
                    local_168.ymin = auVar28._4_4_;
                    local_168.area = (float)vextractps_avx(auVar35,2);
                    this_00 = (vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
                               *)(local_198.
                                  super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + local_170);
                    __position._M_current = *(BBoxRect **)(this_00 + 8);
                    local_168.score = fVar26;
                    local_168.xmax = auVar45._8_4_;
                    local_168.ymax = auVar45._12_4_;
                    local_168.label = iVar9;
                    if (__position._M_current == *(BBoxRect **)(this_00 + 0x10)) {
                      std::
                      vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
                      ::_M_realloc_insert<ncnn::Yolov3DetectionOutput::BBoxRect_const&>
                                (this_00,__position,&local_168);
                    }
                    else {
                      (__position._M_current)->xmax = (float)(int)auVar45._8_8_;
                      (__position._M_current)->ymax = (float)(int)((ulong)auVar45._8_8_ >> 0x20);
                      (__position._M_current)->area = local_168.area;
                      (__position._M_current)->label = iVar9;
                      (__position._M_current)->score = fVar26;
                      (__position._M_current)->xmin = local_168.xmin;
                      (__position._M_current)->ymin = local_168.ymin;
                      (__position._M_current)->xmax = auVar45._8_4_;
                      *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 0x1c;
                    }
                  }
                  pfVar24 = pfVar24 + 1;
                  local_100 = local_100 + 1;
                  local_108 = local_108 + 1;
                  local_110 = local_110 + 1;
                  pfVar17 = pfVar17 + 1;
                  lVar22 = lVar22 + 1;
                  in_R10 = local_b0;
                } while (lVar22 != local_b0);
              }
              lVar22 = local_c0 + 1;
            } while (lVar22 != local_118);
            pp_Var14 = this->_vptr_Yolov3DetectionOutput_x86_avx;
            pMVar21 = local_e0;
            lVar22 = local_d8;
          }
          local_170 = local_170 + 1;
          p_Var18 = pp_Var14[-3];
          p_Var19 = (_func_int *)((long)&this->_vptr_Yolov3DetectionOutput_x86_avx + (long)p_Var18);
        } while (local_170 < *(int *)(&this->field_0xd4 + (long)p_Var18));
      }
      if (0 < *(int *)(&this->field_0xd4 + (long)p_Var18)) {
        lVar22 = 8;
        lVar11 = 0;
        do {
          std::
          vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
          ::
          _M_range_insert<__gnu_cxx::__normal_iterator<ncnn::Yolov3DetectionOutput::BBoxRect_const*,std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>>>
                    ((vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
                      *)&local_148,
                     local_148.
                     super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
                     *(undefined8 *)
                      ((long)local_198.
                             super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + lVar22 + -8),
                     *(undefined8 *)
                      ((long)&((local_198.
                                super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                              )._M_impl.super__Vector_impl_data._M_start + lVar22));
          lVar11 = lVar11 + 1;
          lVar22 = lVar22 + 0x18;
        } while (lVar11 < *(int *)(&this->field_0xd4 +
                                  (long)this->_vptr_Yolov3DetectionOutput_x86_avx[-3]));
      }
      std::
      vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
      ::~vector(&local_198);
      local_178 = local_178 + 1;
    } while (local_178 <
             (ulong)(((long)(local_e8->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)(local_e8->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                            _M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7));
  }
  Yolov3DetectionOutput::qsort_descent_inplace
            ((Yolov3DetectionOutput *)
             ((long)&this->_vptr_Yolov3DetectionOutput_x86_avx +
             (long)this->_vptr_Yolov3DetectionOutput_x86_avx[-3]),&local_148);
  local_168.score = 0.0;
  local_168.xmin = 0.0;
  local_168.ymin = 0.0;
  local_168.xmax = 0.0;
  local_168.ymax = 0.0;
  local_168.area = 0.0;
  Yolov3DetectionOutput::nms_sorted_bboxes
            ((Yolov3DetectionOutput *)
             ((long)&this->_vptr_Yolov3DetectionOutput_x86_avx +
             (long)this->_vptr_Yolov3DetectionOutput_x86_avx[-3]),&local_148,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_168,
             *(float *)(&this->field_0xdc + (long)this->_vptr_Yolov3DetectionOutput_x86_avx[-3]));
  local_198.
  super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
  ._M_impl.super__Vector_impl_data._0_16_ = ZEXT816(0);
  local_198.
  super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar22 = CONCAT44(local_168.xmin,local_168.score);
  lVar11 = CONCAT44(local_168.xmax,local_168.ymin);
  if (lVar11 == lVar22) {
    pvVar20 = (pointer)0x0;
    iVar10 = 0;
  }
  else {
    uVar25 = 0;
    do {
      __args = local_148.
               super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
               ._M_impl.super__Vector_impl_data._M_start + *(long *)(lVar22 + uVar25 * 8);
      if (local_198.
          super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_198.
          super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
        ::_M_realloc_insert<ncnn::Yolov3DetectionOutput::BBoxRect_const&>
                  ((vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
                    *)&local_198,
                   (iterator)
                   local_198.
                   super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,__args);
        lVar22 = CONCAT44(local_168.xmin,local_168.score);
        lVar11 = CONCAT44(local_168.xmax,local_168.ymin);
      }
      else {
        uVar5 = *(undefined8 *)__args;
        uVar6 = *(undefined8 *)&__args->ymin;
        *(undefined1 (*) [16])
         ((long)local_198.
                super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish + 0xc) =
             *(undefined1 (*) [16])&__args->xmax;
        *(undefined8 *)
         local_198.
         super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish = uVar5;
        *(undefined8 *)
         ((long)local_198.
                super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish + 8) = uVar6;
        local_198.
        super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (pointer)((long)local_198.
                             super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish + 0x1c);
      }
      uVar25 = uVar25 + 1;
    } while (uVar25 < (ulong)(lVar11 - lVar22 >> 3));
    _h = (int)((long)local_198.
                     super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_198.
                     super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x49249249;
    iVar10 = 0;
    if (_h != 0) {
      this_01 = (local_f8->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      Mat::create(this_01,6,_h,4,local_f0->blob_allocator);
      iVar10 = -100;
      if (((this_01->data != (void *)0x0) && ((long)this_01->c * this_01->cstep != 0)) &&
         (iVar10 = 0, 0 < (int)_h)) {
        iVar9 = this_01->w;
        sVar2 = this_01->elemsize;
        puVar13 = (undefined4 *)((long)this_01->data + 0x14);
        iVar10 = 0;
        lVar22 = 0;
        do {
          uVar15 = *(undefined4 *)
                    ((long)&((local_198.
                              super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                            )._M_impl.super__Vector_impl_data._M_start + lVar22);
          puVar13[-5] = (float)(*(int *)((long)&local_198.
                                                super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start[1].
                                                super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                                                ._M_impl.super__Vector_impl_data._M_start + lVar22)
                               + 1);
          puVar13[-4] = uVar15;
          puVar13[-3] = *(undefined4 *)
                         ((long)&((local_198.
                                   super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                                 )._M_impl.super__Vector_impl_data._M_start + lVar22 + 4);
          puVar13[-2] = *(undefined4 *)
                         ((long)&((local_198.
                                   super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                                 )._M_impl.super__Vector_impl_data._M_finish + lVar22);
          puVar13[-1] = *(undefined4 *)
                         ((long)&((local_198.
                                   super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                                 )._M_impl.super__Vector_impl_data._M_finish + lVar22 + 4);
          *puVar13 = *(undefined4 *)
                      ((long)&((local_198.
                                super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                              )._M_impl.super__Vector_impl_data._M_end_of_storage + lVar22);
          lVar22 = lVar22 + 0x1c;
          puVar13 = (undefined4 *)((long)puVar13 + (long)iVar9 * sVar2);
        } while ((ulong)(_h & 0x7fffffff) * 0x1c != lVar22);
      }
    }
    pvVar20 = local_198.
              super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  }
  if (pvVar20 != (pointer)0x0) {
    operator_delete(pvVar20,(long)local_198.
                                  super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar20
                   );
  }
  pvVar7 = (void *)CONCAT44(local_168.xmin,local_168.score);
  if (pvVar7 != (void *)0x0) {
    operator_delete(pvVar7,CONCAT44(local_168.area,local_168.ymax) - (long)pvVar7);
  }
LAB_002b81d9:
  if (local_148.
      super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_148.
                    super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_148.
                          super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_148.
                          super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return iVar10;
}

Assistant:

int Yolov3DetectionOutput_x86_avx::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    // gather all box
    std::vector<BBoxRect> all_bbox_rects;

    for (size_t b = 0; b < bottom_blobs.size(); b++)
    {
        std::vector<std::vector<BBoxRect> > all_box_bbox_rects;
        all_box_bbox_rects.resize(num_box);
        const Mat& bottom_top_blobs = bottom_blobs[b];

        int w = bottom_top_blobs.w;
        int h = bottom_top_blobs.h;
        int channels = bottom_top_blobs.c;
        //printf("%d %d %d\n", w, h, channels);
        const int channels_per_box = channels / num_box;

        // anchor coord + box score + num_class
        if (channels_per_box != 4 + 1 + num_class)
            return -1;
        size_t mask_offset = b * num_box;
        int net_w = (int)(anchors_scale[b] * w);
        int net_h = (int)(anchors_scale[b] * h);
//printf("%d %d\n", net_w, net_h);

//printf("%d %d %d\n", w, h, channels);
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp = 0; pp < num_box; pp++)
        {
            int p = pp * channels_per_box;
            int biases_index = static_cast<int>(mask[pp + mask_offset]);
            //printf("%d\n", biases_index);
            const float bias_w = biases[biases_index * 2];
            const float bias_h = biases[biases_index * 2 + 1];
            //printf("%f %f\n", bias_w, bias_h);
            const float* xptr = bottom_top_blobs.channel(p);
            const float* yptr = bottom_top_blobs.channel(p + 1);
            const float* wptr = bottom_top_blobs.channel(p + 2);
            const float* hptr = bottom_top_blobs.channel(p + 3);

            const float* box_score_ptr = bottom_top_blobs.channel(p + 4);

            // softmax class scores
            Mat scores = bottom_top_blobs.channel_range(p + 5, num_class);
            //softmax->forward_inplace(scores, opt);

            const int cs = scores.cstep;

#if __AVX__
            const __m256i vi = _mm256_setr_epi32(
                                   0, cs * 1, cs * 2, cs * 3, cs * 4, cs * 5, cs * 6, cs * 7);
#endif

            for (int i = 0; i < h; i++)
            {
                for (int j = 0; j < w; j++)
                {
#if 0
                    int class_index = 0;
                    float class_score = -FLT_MAX;
                    for (int q = 0; q < num_class; q++)
                    {
                        float score = scores.channel(q).row(i)[j];
                        if (score > class_score)
                        {
                            class_index = q;
                            class_score = score;
                        }
                    }
#else
                    // find class index with max class score
                    int class_index = 0;
                    float class_score = -FLT_MAX;
                    float* ptr = ((float*)scores.data) + i * w + j;
                    float* end = ptr + num_class * cs;
                    int q = 0;
#if __AVX2__
                    float* end8 = ptr + (num_class & -8) * cs;
                    unsigned long index;

                    for (; ptr < end8; ptr += 8 * cs, q += 8)
                    {
                        __m256 p = _mm256_i32gather_ps(ptr, vi, 4);
                        __m256 t = _mm256_max_ps(p, _mm256_permute2f128_ps(p, p, 1));
                        t = _mm256_max_ps(t, _mm256_permute_ps(t, 0x4e));
                        t = _mm256_max_ps(t, _mm256_permute_ps(t, 0xb1));
                        float score = _mm_cvtss_f32(_mm256_extractf128_ps(t, 0));

                        if (score > class_score)
                        {
                            __m256 mi = _mm256_cmp_ps(p, t, _CMP_EQ_OQ);
                            int mask = _mm256_movemask_ps(mi);
#ifdef _MSC_VER
                            BitScanForward(&index, mask);
#else
                            index = __builtin_ctz(mask);
#endif
                            class_index = q + index;
                            class_score = score;
                        }
                    }
#endif

                    for (; ptr < end; ptr += cs, q++)
                    {
                        if (*ptr > class_score)
                        {
                            class_index = q;
                            class_score = *ptr;
                        }
                    }
#endif
                    //sigmoid(box_score) * sigmoid(class_score)
                    float confidence = 1.f / ((1.f + exp(-box_score_ptr[0]) * (1.f + exp(-class_score))));
                    if (confidence >= confidence_threshold)
                    {
                        // region box
                        float bbox_cx = (j + sigmoid(xptr[0])) / w;
                        float bbox_cy = (i + sigmoid(yptr[0])) / h;
                        float bbox_w = static_cast<float>(exp(wptr[0]) * bias_w / net_w);
                        float bbox_h = static_cast<float>(exp(hptr[0]) * bias_h / net_h);

                        float bbox_xmin = bbox_cx - bbox_w * 0.5f;
                        float bbox_ymin = bbox_cy - bbox_h * 0.5f;
                        float bbox_xmax = bbox_cx + bbox_w * 0.5f;
                        float bbox_ymax = bbox_cy + bbox_h * 0.5f;

                        float area = bbox_w * bbox_h;

                        BBoxRect c = {confidence, bbox_xmin, bbox_ymin, bbox_xmax, bbox_ymax, area, class_index};
                        all_box_bbox_rects[pp].push_back(c);
                    }

                    xptr++;
                    yptr++;
                    wptr++;
                    hptr++;

                    box_score_ptr++;
                }
            }
        }

        for (int i = 0; i < num_box; i++)
        {
            const std::vector<BBoxRect>& box_bbox_rects = all_box_bbox_rects[i];

            all_bbox_rects.insert(all_bbox_rects.end(), box_bbox_rects.begin(), box_bbox_rects.end());
        }
    }

    // global sort inplace
    qsort_descent_inplace(all_bbox_rects);

    // apply nms
    std::vector<size_t> picked;
    nms_sorted_bboxes(all_bbox_rects, picked, nms_threshold);

    // select
    std::vector<BBoxRect> bbox_rects;

    for (size_t i = 0; i < picked.size(); i++)
    {
        size_t z = picked[i];
        bbox_rects.push_back(all_bbox_rects[z]);
    }

    // fill result
    int num_detected = static_cast<int>(bbox_rects.size());
    if (num_detected == 0)
        return 0;

    Mat& top_blob = top_blobs[0];
    top_blob.create(6, num_detected, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    for (int i = 0; i < num_detected; i++)
    {
        const BBoxRect& r = bbox_rects[i];
        float score = r.score;
        float* outptr = top_blob.row(i);

        outptr[0] = static_cast<float>(r.label + 1); // +1 for prepend background class
        outptr[1] = score;
        outptr[2] = r.xmin;
        outptr[3] = r.ymin;
        outptr[4] = r.xmax;
        outptr[5] = r.ymax;
    }

    return 0;
}